

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void TestSpanSet(void)

{
  size_type sVar1;
  reference ppSVar2;
  pair<std::_Rb_tree_const_iterator<tcmalloc::Span_*>,_bool> pVar3;
  key_type local_120;
  _Rb_tree_const_iterator<tcmalloc::Span_*> local_118;
  key_type local_110;
  _Rb_tree_const_iterator<tcmalloc::Span_*> local_108;
  undefined1 local_100 [8];
  Span bound;
  Span *local_68;
  Span *s4;
  Span *s3;
  Span *s2;
  Span *local_40;
  Span *s1;
  SpanSet set;
  
  printf("===================== TestSpanSet BEGIN =====================\n");
  std::
  set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
  ::set((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
         *)&s1);
  local_40 = tcmalloc::NewSpan(4,2);
  s3 = tcmalloc::NewSpan(1,3);
  s4 = tcmalloc::NewSpan(10,3);
  local_68 = tcmalloc::NewSpan(0xc,5);
  std::
  set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
  ::insert((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
            *)&s1,&local_40);
  std::
  set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
  ::insert((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
            *)&s1,&s3);
  std::
  set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
  ::insert((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
            *)&s1,&s4);
  std::
  set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
  ::insert((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
            *)&s1,&local_68);
  sVar1 = std::
          set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
          ::size((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
                  *)&s1);
  if (sVar1 != 4) {
    __assert_fail("set.size() == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x5a,"void TestSpanSet()");
  }
  pVar3 = std::
          set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
          ::insert((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
                    *)&s1,&local_40);
  bound.location = (uint64_t)pVar3.first._M_node;
  sVar1 = std::
          set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
          ::size((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
                  *)&s1);
  if (sVar1 != 4) {
    __assert_fail("set.size() == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x5c,"void TestSpanSet()");
  }
  tcmalloc::Span::Span((Span *)local_100);
  bound.page_id = 3;
  bound.next = (Span *)0x0;
  local_110 = (key_type)local_100;
  local_108._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
       ::upper_bound((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
                      *)&s1,&local_110);
  ppSVar2 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_108);
  if (*ppSVar2 != s3) {
    __assert_fail("(*(set.upper_bound(&bound))) == s2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x61,"void TestSpanSet()");
  }
  bound.page_id = 4;
  bound.next = (Span *)0x0;
  local_120 = (key_type)local_100;
  local_118._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
       ::upper_bound((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
                      *)&s1,&local_120);
  ppSVar2 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_118);
  if (*ppSVar2 == local_68) {
    tcmalloc::DeleteSpan(local_40);
    tcmalloc::DeleteSpan(s3);
    tcmalloc::DeleteSpan(s4);
    tcmalloc::DeleteSpan(local_68);
    printf("===================== TestSpanSet PASS =====================\n");
    std::
    set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
    ::~set((set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
            *)&s1);
    return;
  }
  __assert_fail("(*(set.upper_bound(&bound))) == s4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                ,100,"void TestSpanSet()");
}

Assistant:

void TestSpanSet() {
    printf("===================== TestSpanSet BEGIN =====================\n");
    tcmalloc::SpanSet set;
    tcmalloc::Span* s1 = tcmalloc::NewSpan(4, 2);
    tcmalloc::Span* s2 = tcmalloc::NewSpan(1, 3);
    tcmalloc::Span* s3 = tcmalloc::NewSpan(10, 3);
    tcmalloc::Span* s4 = tcmalloc::NewSpan(12, 5);

    set.insert(s1);
    set.insert(s2);
    set.insert(s3);
    set.insert(s4);
    assert(set.size() == 4);
    set.insert(s1);
    assert(set.size() == 4);

    tcmalloc::Span bound;
    bound.npages = 3;
    bound.page_id = 0;
    assert((*(set.upper_bound(&bound))) == s2);
    bound.npages = 4;
    bound.page_id = 0;
    assert((*(set.upper_bound(&bound))) == s4);

    tcmalloc::DeleteSpan(s1);
    tcmalloc::DeleteSpan(s2);
    tcmalloc::DeleteSpan(s3);
    tcmalloc::DeleteSpan(s4);
    printf("===================== TestSpanSet PASS =====================\n");
}